

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O2

void __thiscall adios2::helper::CommImplMPI::~CommImplMPI(CommImplMPI *this)

{
  MPI_Comm poVar1;
  int flag;
  int local_c;
  
  (this->super_CommImpl)._vptr_CommImpl = (_func_int **)&PTR__CommImplMPI_0016e6c8;
  MPI_Finalized(&local_c);
  if ((((local_c == 0) && (poVar1 = this->m_MPIComm, poVar1 != (MPI_Comm)&ompi_mpi_comm_self)) &&
      (poVar1 != (MPI_Comm)&ompi_mpi_comm_null)) && (poVar1 != (MPI_Comm)&ompi_mpi_comm_world)) {
    MPI_Comm_free(&this->m_MPIComm);
  }
  adios2::helper::CommImpl::~CommImpl(&this->super_CommImpl);
  return;
}

Assistant:

CommImplMPI::~CommImplMPI()
{
    // Handle the case where MPI is finalized before the ADIOS destructor is
    // called, which happens, e.g., with global / static ADIOS objects
    int flag;
    MPI_Finalized(&flag);
    if (!flag)
    {
        if (m_MPIComm != MPI_COMM_NULL && m_MPIComm != MPI_COMM_WORLD && m_MPIComm != MPI_COMM_SELF)
        {
            MPI_Comm_free(&m_MPIComm);
        }
    }
}